

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyZeroFill(Recycler *this,void *address,size_t size)

{
  code *pcVar1;
  byte c;
  bool bVar2;
  undefined4 *puVar3;
  
  c = 0xca;
  if (this->verifyEnabled == false) {
    c = '\0';
  }
  bVar2 = IsAll((byte *)address,size,c);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e75,"(IsAll((byte *)address, size, expectedFill))",
                       "IsAll((byte *)address, size, expectedFill)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
Recycler::VerifyZeroFill(void * address, size_t size)
{
    byte expectedFill = 0;
#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        expectedFill = Recycler::VerifyMemFill;
    }
#endif

    Assert(IsAll((byte *)address, size, expectedFill));
}